

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::GayBerneAtomTypesSectionParser::parseLine
          (GayBerneAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  RealType dw;
  string atomTypeName;
  GayBerneAdapter gba;
  StringTokenizer tokenizer;
  string local_d8;
  double local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  double local_90;
  double local_88;
  GayBerneAdapter local_80;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8," ;\t\n\r",(allocator<char> *)&local_80);
  StringTokenizer::StringTokenizer(&local_78,line,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 7) {
    snprintf(painCave.errMsg,2000,
             "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n\tPlease note that GB atoms now require separate specification of epsilon\n\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for each\n\tellipsoid type.\n"
             ,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_88 = (this->options_->EnergyUnitScaling).data_;
    local_90 = (this->options_->DistanceUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_78);
    pAVar2 = ForceField::getAtomType(ff,&local_d8);
    if (pAVar2 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "GayBerneAtomTypesSectionParser: Can not find matching AtomType %s\n\tfor this GayBerne atom type\n"
               ,local_d8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_98 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_78);
      dw = StringTokenizer::nextTokenAsDouble(&local_78);
      local_80.at_ = pAVar2;
      GayBerneAdapter::makeGayBerne
                (&local_80,local_98 * local_90,local_a0 * local_90,local_a8 * local_88,
                 local_b0 * local_88,local_b8 * local_88,dw);
    }
    std::__cxx11::string::~string((string *)&local_d8);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void GayBerneAtomTypesSectionParser::parseLine(ForceField& ff,
                                                 const std::string& line,
                                                 int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    // in GayBerneAtomTypesSection, a line at least contains 7 tokens
    // atomTypeName   d    l    eps_X  eps_S   eps_E   dw
    if (nTokens < 7) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "GayBerneAtomTypesSectionParser: Not enough tokens at line %d\n"
          "\tPlease note that GB atoms now require separate specification of "
          "epsilon\n"
          "\tvalues for cross (X), Side-by-Side (S), and End-to-End (E) for "
          "each\n"
          "\tellipsoid type.\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType eus_            = options_.getEnergyUnitScaling();
      RealType dus_            = options_.getDistanceUnitScaling();
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        RealType GB_d     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_l     = dus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_X = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_S = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_eps_E = eus_ * tokenizer.nextTokenAsDouble();
        RealType GB_dw    = tokenizer.nextTokenAsDouble();

        GayBerneAdapter gba = GayBerneAdapter(atomType);
        gba.makeGayBerne(GB_d, GB_l, GB_eps_X, GB_eps_S, GB_eps_E, GB_dw);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GayBerneAtomTypesSectionParser: Can not find matching "
                 "AtomType %s\n"
                 "\tfor this GayBerne atom type\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }